

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::TraceUpdateConstructorCache
               (ConstructorCache *ctorCache,FunctionBody *ctorBody,bool updated,char16 *reason)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  int iVar2;
  undefined4 extraout_var;
  char16_t *pcVar4;
  char16_t *pcVar5;
  char16_t *local_b0;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  char16 *ctorName;
  char16 *reason_local;
  bool updated_local;
  FunctionBody *ctorBody_local;
  ConstructorCache *ctorCache_local;
  undefined8 uVar3;
  
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)ctorBody);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)ctorBody);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,ConstructorCachePhase,sourceContextId,functionId
                           );
  if (bVar1) {
    iVar2 = (*(ctorBody->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar3 = CONCAT44(extraout_var,iVar2);
    pcVar4 = L"did not update";
    if (updated) {
      pcVar4 = L"updated";
    }
    unique0x10000165 = uVar3;
    if (ctorBody == (FunctionBody *)0x0) {
      local_b0 = L"(null)";
    }
    else {
      local_b0 = FunctionProxy::GetDebugNumberSet
                           ((FunctionProxy *)ctorBody,(wchar (*) [42])local_88);
    }
    pcVar5 = L", because";
    if (updated) {
      pcVar5 = L"";
    }
    Output::Print(L"CtorCache: %s cache (0x%p) for ctor %s (%s)%s %s: ",pcVar4,ctorBody,uVar3,
                  local_b0,pcVar5,reason);
    ConstructorCache::Dump(ctorCache);
    Output::Print(L"\n");
    Output::Flush();
  }
  return;
}

Assistant:

void JavascriptOperators::TraceUpdateConstructorCache(const ConstructorCache* ctorCache, const FunctionBody* ctorBody, bool updated, const char16* reason)
    {
#if DBG_DUMP
        if (PHASE_TRACE(Js::ConstructorCachePhase, ctorBody))
        {
            const char16* ctorName = ctorBody->GetDisplayName();
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

            Output::Print(_u("CtorCache: %s cache (0x%p) for ctor %s (%s)%s %s: "),
                updated ? _u("updated") : _u("did not update"), ctorBody, ctorName,
                ctorBody ? const_cast<Js::FunctionBody *>(ctorBody)->GetDebugNumberSet(debugStringBuffer) : _u("(null)"),
                updated ? _u("") : _u(", because") , reason);
            ctorCache->Dump();
            Output::Print(_u("\n"));
            Output::Flush();
        }
#endif
    }